

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int __thiscall ncnn::Clip::forward_inplace_int8(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RSI;
  int i;
  char *ptr;
  int q;
  char max_int8;
  char min_int8;
  int size;
  int channels;
  int h;
  int w;
  float in_stack_ffffffffffffff60;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int local_88;
  Mat local_78;
  Mat *local_38;
  int local_30;
  char local_2a;
  char local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  local_29 = ::float2int8(in_stack_ffffffffffffff60);
  local_2a = ::float2int8(in_stack_ffffffffffffff60);
  for (local_30 = 0; local_30 < local_24; local_30 = local_30 + 1) {
    this_00 = &local_78;
    Mat::channel(in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff68 = (Mat *)Mat::operator_cast_to_signed_char_(this_00);
    Mat::~Mat((Mat *)0x1ab250);
    for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
      if (*(char *)((long)&in_stack_ffffffffffffff68->data + (long)local_88) < local_29) {
        *(char *)((long)&in_stack_ffffffffffffff68->data + (long)local_88) = local_29;
      }
      if (local_2a < *(char *)((long)&in_stack_ffffffffffffff68->data + (long)local_88)) {
        *(char *)((long)&in_stack_ffffffffffffff68->data + (long)local_88) = local_2a;
      }
    }
    local_38 = in_stack_ffffffffffffff68;
  }
  return 0;
}

Assistant:

int Clip::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    signed char min_int8 = float2int8(min);
    signed char max_int8 = float2int8(max);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        signed char* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min_int8)
                ptr[i] = min_int8;
            if (ptr[i] > max_int8)
                ptr[i] = max_int8;
        }
    }

    return 0;
}